

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coherent_memory_write.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  GLbitfield GVar1;
  GLint GVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  int i_1;
  int iVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLenum GVar11;
  GLint GVar12;
  int iVar13;
  GLint GVar14;
  void *pvVar15;
  GLsync p_Var16;
  void *pvVar17;
  float *pfVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  void **ppvVar22;
  long lVar23;
  float *pfVar24;
  int iVar25;
  char *__s;
  int iVar26;
  int iVar27;
  float *vertices;
  long lVar28;
  GLuint *pGVar29;
  int i;
  int iVar30;
  size_t sVar31;
  bool bVar32;
  bool bVar33;
  uint local_324;
  int success;
  int local_304 [9];
  ulong local_2e0;
  long local_2d8;
  GLFWwindow *local_2d0;
  size_t local_2c8;
  long local_2c0;
  long local_2b8;
  GLint alignment;
  size_t mapping_offsets [9];
  int local_258 [8];
  int quads_positions [4] [2];
  
  glfwInit();
  local_324 = 1;
  glfwWindowHint(0x20004,1);
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22006,1);
  glfwWindowHint(0x22008,0x32001);
  local_2d0 = glfwCreateWindow(0x400,0x400,"Coherent memory write",(GLFWmonitor *)0x0,
                               (GLFWwindow *)0x0);
  if (local_2d0 == (GLFWwindow *)0x0) {
    local_324 = 0x7d;
  }
  else {
    glfwMakeContextCurrent(local_2d0);
    iVar7 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar7 != 0) {
      (*glad_glGetIntegerv)(0x90df,&alignment);
      mapping_offsets[3] = sysconf(0x1e);
      mapping_offsets[1] = (size_t)alignment;
      mapping_offsets[0] = 0;
      mapping_offsets[2] = mapping_offsets[3] >> 1;
      mapping_offsets[4] = mapping_offsets[3] + mapping_offsets[1];
      mapping_offsets[5] = mapping_offsets[3] - mapping_offsets[1];
      mapping_offsets[6] = mapping_offsets[3] * 2;
      mapping_offsets[7] = mapping_offsets[3] * 10;
      mapping_offsets[8] = mapping_offsets[3] * 4 + mapping_offsets[1] * 2;
      GVar8 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar8,1,&vert_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar8);
      (*glad_glGetShaderiv)(GVar8,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar8,0x200,(GLsizei *)0x0,(GLchar *)quads_positions);
        printf("Vertex shader compilation failed: %s\n",quads_positions);
      }
      GVar9 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar9,1,&frag_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar9);
      (*glad_glGetShaderiv)(GVar9,0x8b81,&success);
      if (success == 0) {
        (*glad_glGetShaderInfoLog)(GVar9,0x200,(GLsizei *)0x0,(GLchar *)quads_positions);
        printf("Fragment shader compilation failed:%s\n",quads_positions);
      }
      GVar10 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar10,GVar8);
      (*glad_glAttachShader)(GVar10,GVar9);
      (*glad_glLinkProgram)(GVar10);
      (*glad_glGetProgramiv)(GVar10,0x8b82,&success);
      if (success == 0) {
        (*glad_glGetProgramInfoLog)(GVar10,0x200,(GLsizei *)0x0,(GLchar *)quads_positions);
        printf("Program linking failed: %s\n",quads_positions);
      }
      (*glad_glDeleteShader)(GVar8);
      (*glad_glDeleteShader)(GVar9);
      if (GVar10 == 0) {
        __assert_fail("prog",
                      "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                      ,0x99,"void build_programm()");
      }
      lVar28 = 0;
      local_2e0 = 0;
      local_324 = 0;
      do {
        GVar1 = (&DAT_00131058)[lVar28];
        uVar19 = 0;
        bVar32 = false;
        local_2d8 = lVar28;
        do {
          sVar31 = mapping_offsets[uVar19];
          pGVar29 = ssbo;
          (*glad_glGenBuffers)(3,ssbo);
          ppvVar22 = coherent_colors;
          lVar28 = 0;
          do {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar28,*pGVar29,sVar31,0x40000);
            (*glad_glBufferStorage)(0x90d2,sVar31 + 0x40000,(void *)0x0,GVar1);
            pvVar15 = (*glad_glMapNamedBufferRange)(*pGVar29,sVar31,0x40000,GVar1);
            *ppvVar22 = pvVar15;
            (*glad_glBindBuffer)(0x90d2,0);
            check_error();
            if (*pGVar29 == 0) {
              __assert_fail("ssbo[i]",
                            "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/coherent_memory_write.cpp"
                            ,0xaf,
                            "bool setup_buffers(const int, const int, const size_t, const GLenum)");
            }
            lVar28 = lVar28 + 1;
            ppvVar22 = ppvVar22 + 1;
            pGVar29 = pGVar29 + 1;
          } while (lVar28 != 3);
          (*glad_glGenFramebuffers)(1,&fbo);
          (*glad_glBindFramebuffer)(0x8d40,fbo);
          (*glad_glGenRenderbuffers)(1,&rbo);
          (*glad_glBindRenderbuffer)(0x8d41,rbo);
          (*glad_glRenderbufferStorage)(0x8d41,0x1908,0x100,0x100);
          (*glad_glFramebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo);
          (*glad_glGenBuffers)(1,&vbo);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glBufferStorage)(0x8892,0xc0,(void *)0x0,GVar1);
          pvVar15 = (*glad_glMapBufferRange)(0x8892,0,0xc0,GVar1);
          (*glad_glGenVertexArrays)(1,&vao);
          (*glad_glBindVertexArray)(vao);
          (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0xc,(void *)0x0);
          (*glad_glEnableVertexAttribArray)(0);
          GVar11 = (*glad_glCheckFramebufferStatus)(0x8d40);
          if (GVar11 == 0x8cd5) {
            (*glad_glBindFramebuffer)(0x8d40,0);
            check_error();
          }
          bVar33 = GVar11 == 0x8cd5;
          if (!bVar33) {
            local_324 = 1;
            break;
          }
          sVar31 = mapping_offsets[uVar19];
          lVar28 = 0;
          local_2c8 = sVar31;
          do {
            GVar2 = (&DAT_001314f0)[lVar28 * 2];
            iVar7 = (&DAT_001314f4)[lVar28 * 2];
            local_2c0 = lVar28;
            (*glad_glBindVertexArray)(vao);
            (*glad_glBindBuffer)(0x8892,vbo);
            pGVar29 = ssbo;
            lVar28 = 0;
            do {
              (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar28,*pGVar29,sVar31,0x40000);
              lVar28 = lVar28 + 1;
              pGVar29 = pGVar29 + 1;
            } while (lVar28 != 3);
            (*glad_glUseProgram)(GVar10);
            (*glad_glBindFramebuffer)(0x8d40,fbo);
            (*glad_glViewport)(0,0,0x100,0x100);
            (*glad_glClearColor)(1.0,0.0,0.0,1.0);
            (*glad_glClear)(0x4000);
            local_258[0] = -0x80;
            local_258[1] = -0x80;
            local_258[2] = 0;
            local_258[3] = -0x80;
            local_258[4] = -0x80;
            local_258[5] = 0;
            local_258[6] = 0;
            local_258[7] = 0;
            GVar12 = (*glad_glGetUniformLocation)(GVar10,"width");
            if (GVar12 != -1) {
              (*glad_glUniform1i)(GVar12,0x100);
            }
            quads_positions[0][0] = -0x80;
            quads_positions[0][1] = -0x80;
            quads_positions[1][0] = 0;
            quads_positions[1][1] = -0x80;
            quads_positions[2][0] = -0x80;
            quads_positions[2][1] = 0;
            quads_positions[3][0] = 0;
            quads_positions[3][1] = 0;
            lVar28 = 0;
            lVar20 = 0;
            do {
              success = quads_positions[lVar28][0];
              local_304[0] = quads_positions[lVar28][1];
              local_304[1] = success;
              local_304[2] = local_304[0] + 0x80;
              local_304[3] = success + 0x80;
              local_304[4] = local_304[0];
              local_304[5] = success + 0x80;
              local_304[6] = local_304[0] + 0x80;
              lVar20 = (long)(int)lVar20;
              lVar21 = 0;
              do {
                *(float *)((long)pvVar15 + lVar20 * 4) =
                     (float)local_304[lVar21 * 2 + -1] * 0.0078125;
                *(float *)((long)pvVar15 + lVar20 * 4 + 4) =
                     (float)local_304[lVar21 * 2] * 0.0078125;
                *(undefined4 *)((long)pvVar15 + lVar20 * 4 + 8) = 0;
                lVar20 = lVar20 + 3;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 4);
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            lVar28 = 0;
            do {
              iVar3 = local_258[lVar28 * 2];
              iVar4 = local_258[lVar28 * 2 + 1];
              lVar20 = (long)iVar4 + 0x80;
              iVar30 = iVar3 + 0x80;
              GVar12 = GVar2;
              if (iVar30 == 0) {
                GVar12 = 0;
              }
              iVar13 = iVar7;
              if ((int)lVar20 == 0) {
                iVar13 = 0;
              }
              local_2b8 = lVar28;
              GVar14 = (*glad_glGetUniformLocation)(GVar10,"offset_x");
              if (GVar14 != -1) {
                (*glad_glUniform1i)(GVar14,GVar12);
              }
              GVar14 = (*glad_glGetUniformLocation)(GVar10,"offset_y");
              if (GVar14 != -1) {
                (*glad_glUniform1i)(GVar14,iVar13);
              }
              lVar28 = local_2b8;
              pvVar6 = coherent_colors[2];
              pvVar5 = coherent_colors[1];
              pvVar17 = coherent_colors[0];
              iVar25 = iVar4 * 0x100 + iVar3 + 0x8080;
              do {
                lVar21 = (long)iVar30 + -1;
                iVar26 = iVar30;
                iVar27 = iVar25;
                do {
                  lVar23 = (long)(iVar27 - (iVar13 * 0x100 + GVar12));
                  *(float *)((long)pvVar17 + lVar23 * 4) = (float)iVar26 * 0.00390625;
                  *(float *)((long)pvVar5 + lVar23 * 4) = (float)(int)lVar20 * 0.00390625;
                  *(float *)((long)pvVar6 + lVar23 * 4) = (float)iVar27 * 1.5258789e-05;
                  lVar21 = lVar21 + 1;
                  iVar27 = iVar27 + 1;
                  iVar26 = iVar26 + 1;
                } while (lVar21 < (long)iVar3 + 0xff);
                iVar25 = iVar25 + 0x100;
                bVar32 = lVar20 < (long)iVar4 + 0xff;
                lVar20 = lVar20 + 1;
              } while (bVar32);
              (*glad_glDrawArrays)(5,(int)local_2b8 * 4,4);
              if ((GVar12 == 0) || (iVar13 == 0)) {
                p_Var16 = (*glad_glFenceSync)(0x9117,0);
                (*glad_glClientWaitSync)(p_Var16,1,0xffffffffffffffff);
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 != 4);
            (*glad_glBindFramebuffer)(0x8ca8,fbo);
            GVar8 = 0;
            (*glad_glBindFramebuffer)(0x8ca9,0);
            (*glad_glBlitFramebuffer)(0,0,0x100,0x100,0,0,0x400,0x400,0x4000,0x2600);
            do {
              (*glad_glBindBufferBase)(0x90d2,GVar8,0);
              GVar8 = GVar8 + 1;
            } while (GVar8 != 3);
            (*glad_glBindBuffer)(0x8892,0);
            (*glad_glBindVertexArray)(0);
            glfwSwapBuffers(local_2d0);
            glfwPollEvents();
            pvVar17 = operator_new__(0x100000);
            (*glad_glReadBuffer)(0x8ce0);
            (*glad_glReadPixels)(0,0,0x100,0x100,0x1908,0x1406,pvVar17);
            sVar31 = local_2c8;
            pfVar18 = (float *)((long)pvVar17 + 0xc);
            bVar32 = true;
            iVar7 = 0;
            lVar28 = 0;
            do {
              lVar20 = 0;
              pfVar24 = pfVar18;
              do {
                if ((((0.01 < ABS((float)(int)lVar20 * -0.00390625 + pfVar24[-3])) ||
                     (0.01 < ABS(pfVar24[-2] - (float)(int)lVar28 * 0.00390625))) ||
                    (0.01 < ABS(pfVar24[-1] - (float)(iVar7 + (int)lVar20) * 1.5258789e-05))) ||
                   (0.01 < ABS(*pfVar24 + -1.0))) {
                  bVar32 = false;
                }
                lVar20 = lVar20 + 1;
                pfVar24 = pfVar24 + 4;
              } while (lVar20 != 0x100);
              lVar28 = lVar28 + 1;
              pfVar18 = pfVar18 + 0x400;
              iVar7 = iVar7 + 0x100;
            } while (lVar28 != 0x100);
            operator_delete__(pvVar17);
            if (!bVar32) {
              bVar33 = false;
            }
            lVar28 = local_2c0 + 1;
          } while (lVar28 != 3);
          sVar31 = mapping_offsets[uVar19];
          pGVar29 = ssbo;
          lVar28 = 0;
          do {
            (*glad_glBindBufferRange)(0x90d2,(GLuint)lVar28,*pGVar29,sVar31,0x40000);
            (*glad_glUnmapNamedBuffer)(*pGVar29);
            (*glad_glBindBufferBase)(0x90d2,(GLuint)lVar28,0);
            lVar28 = lVar28 + 1;
            pGVar29 = pGVar29 + 1;
          } while (lVar28 != 3);
          (*glad_glBindVertexArray)(vao);
          (*glad_glBindBuffer)(0x8892,vbo);
          (*glad_glUnmapBuffer)(0x8892);
          (*glad_glBindBuffer)(0x8892,0);
          (*glad_glBindVertexArray)(0);
          bVar32 = 7 < uVar19;
          uVar19 = uVar19 + 1;
        } while (uVar19 != 9);
        if (!bVar32) break;
        lVar28 = local_2d8 + 1;
        local_2e0 = CONCAT71((int7)((ulong)local_2d8 >> 8),local_2d8 != 0);
      } while (local_2d8 == 0);
      if ((local_2e0 & 1) != 0) {
        glfwDestroyWindow(local_2d0);
        glfwTerminate();
        __s = "Probe failed ";
        if (bVar33) {
          __s = "Passed successfully ";
        }
        puts(__s);
        local_324 = (uint)(byte)~bVar33;
      }
    }
  }
  return local_324;
}

Assistant:

int
main(int argc, char** argv) {
    glfwInit();

    glfwWindowHint(GLFW_VISIBLE, GLFW_TRUE);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(1024, 1024, "Coherent memory write", NULL, NULL);

    if (!window) {
        return EXIT_SKIP;
    }

    glfwMakeContextCurrent(window);

    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        return EXIT_FAILURE;
    }

    GLint alignment;
    glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &alignment);
    const size_t page_size = getSystemPageSize();
    const size_t ssbo_alignment = static_cast<const size_t>(alignment);

    bool pass = true;
    const int width = 256;
    const int height = 256;

    const int mapping_offsets_count = 9;
    const size_t mapping_offsets[mapping_offsets_count] = {
        0,
        ssbo_alignment,
        page_size / 2,
        page_size,
        page_size + ssbo_alignment,
        page_size - ssbo_alignment,
        page_size * 2,
        page_size * 10,
        page_size * 4 + 2 * ssbo_alignment
    };

    const int quads_offstes_count = 3;
    const int quads_offsets[quads_offstes_count][2] = {
        { width / 4, height / 4 },
        { width / 2, height / 2 },
        { 0, 0 }
    };

    const int mapping_flags_count = 2;
    const GLenum mapping_flags[mapping_flags_count] = {
        GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT,
        GL_MAP_WRITE_BIT | GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT
    };

    build_programm();

    for (int i = 0; i < mapping_flags_count; i++) {
        for (int j = 0; j < mapping_offsets_count; j++) {
            pass = setup_buffers(width, height, mapping_offsets[j], mapping_flags[i]);

            if (!pass) {
                return EXIT_FAILURE;
            }

            for (int k = 0; k < quads_offstes_count; k++) {
                draw(window, width, height, mapping_offsets[j],
                    quads_offsets[k][0], quads_offsets[k][1],
                    mapping_flags[i]);

                pass = probe(width, height) && pass;
            }
            unmap_buffers(width, height, mapping_offsets[j]);
        }
    }

    glfwDestroyWindow(window);
    glfwTerminate();

    if (pass) {
        printf("Passed successfully \n");
    } else {
        printf("Probe failed \n");
    }

    return pass ? 0 : EXIT_FAILURE;
}